

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::SPFMethod::selectMolecule(SPFMethod *this)

{
  element_type *peVar1;
  long in_RDI;
  SelectionManager *this_00;
  bool hasSelectedMolecule;
  shared_ptr<OpenMD::SPFData> spfData;
  shared_ptr<OpenMD::SPFData> *in_stack_000001a0;
  SPFMethod *in_stack_000001a8;
  Snapshot *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  string *this_01;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  SPFMethod *this_02;
  bool local_d1;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  SelectionEvaluator *in_stack_ffffffffffffff50;
  string local_a0 [32];
  string local_80 [39];
  byte local_59;
  byte local_31;
  byte local_19;
  
  Snapshot::getSPFData(in_stack_fffffffffffffef8);
  *(undefined8 *)(in_RDI + 0x1f88) = *(undefined8 *)(in_RDI + 0x2b0);
  peVar1 = std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x3ee07f);
  local_31 = 0;
  local_59 = 0;
  if (peVar1->globalID == -1) {
    std::shared_ptr<OpenMD::SPFData>::shared_ptr
              ((shared_ptr<OpenMD::SPFData> *)in_stack_ffffffffffffff00,
               (shared_ptr<OpenMD::SPFData> *)in_stack_fffffffffffffef8);
    local_31 = 1;
    local_d1 = setSelectedMolecule(in_stack_000001a8,in_stack_000001a0);
    in_stack_ffffffffffffff3f = local_d1;
  }
  else {
    this_02 = (SPFMethod *)&stack0xffffffffffffffa8;
    std::shared_ptr<OpenMD::SPFData>::shared_ptr
              ((shared_ptr<OpenMD::SPFData> *)in_stack_ffffffffffffff00,
               (shared_ptr<OpenMD::SPFData> *)in_stack_fffffffffffffef8);
    local_59 = 1;
    local_d1 = getSelectedMolecule(this_02,(shared_ptr<OpenMD::SPFData> *)
                                           CONCAT17(in_stack_ffffffffffffff1f,
                                                    in_stack_ffffffffffffff18));
  }
  if ((local_59 & 1) != 0) {
    std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x3ee13a);
  }
  if ((local_31 & 1) != 0) {
    std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x3ee153);
  }
  local_19 = local_d1 & 1;
  if (local_19 == 0) {
    *(undefined1 *)(in_RDI + 0x28f1) = 1;
  }
  else {
    std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3ee17b);
    std::__cxx11::to_string(in_stack_ffffffffffffff4c);
    std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    this_00 = (SelectionManager *)(in_RDI + 0x22b8);
    this_01 = local_80;
    std::__cxx11::string::operator=((string *)this_00,this_01);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string(local_a0);
    SelectionEvaluator::loadScriptString
              (in_stack_ffffffffffffff50,
               (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    SelectionEvaluator::evaluate
              ((SelectionEvaluator *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    SelectionManager::setSelectionSet(this_00,(SelectionSet *)this_01);
    SelectionSet::~SelectionSet((SelectionSet *)0x3ee235);
  }
  SPFForceManager::setHasSelectedMolecule
            (*(SPFForceManager **)(in_RDI + 0x22b0),(bool)(local_19 & 1));
  std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x3ee32a);
  return;
}

Assistant:

void SPFMethod::selectMolecule() {
    std::shared_ptr<SPFData> spfData = currentSnap_->getSPFData();

    // Always reset spfTarget_ before selecting a new particle
    spfTarget_ = particleTarget_;

    bool hasSelectedMolecule = (spfData->globalID == -1) ?
                                   setSelectedMolecule(spfData) :
                                   getSelectedMolecule(spfData);

    if (hasSelectedMolecule) {
      selectedMoleculeStr_ = "select " + std::to_string(spfData->globalID);

      selectedMoleculeEvaluator_.loadScriptString(selectedMoleculeStr_);
      selectedMoleculeMan_.setSelectionSet(
          selectedMoleculeEvaluator_.evaluate());

#ifdef IS_MPI
      MPI_Bcast(&spfTarget_, 1, MPI_REALTYPE,
                info_->getMolToProc(spfData->globalID), MPI_COMM_WORLD);
#endif
    } else {
      failedLastTrial_ = true;
    }

    forceManager_->setHasSelectedMolecule(hasSelectedMolecule);
  }